

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  
  mean_double_1_suite::run();
  mean_double_2_suite::run();
  mean_double_3_suite::run();
  mean_double_4_suite::run();
  mean_float_2_suite::run();
  mean_int_2_suite::run();
  variance_double_1_suite::run();
  variance_double_2_suite::run();
  variance_double_4_suite::run();
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    mean_double_1_suite::run();
    mean_double_2_suite::run();
    mean_double_3_suite::run();
    mean_double_4_suite::run();
    mean_float_2_suite::run();
    mean_int_2_suite::run();

    variance_double_1_suite::run();
    variance_double_2_suite::run();
    variance_double_4_suite::run();

    return boost::report_errors();
}